

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O1

void __thiscall cubeb_init_destroy_stream_Test::TestBody(cubeb_init_destroy_stream_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  int iVar3;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar_2;
  cubeb_stream *stream;
  cubeb *ctx;
  int r;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  r = common_init(&ctx,"test_sanity");
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_2,in_RCX);
  if (gtest_ar.success_ == false) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x9b;
    gtest_ar_2._0_8_ = psVar2;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,(void **)&gtest_ar_2);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0xac44000000;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
      actual = (anon_enum_32 *)0x0;
      r = cubeb_stream_init(ctx,&stream,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                            (cubeb_devid)0x0,(cubeb_stream_params *)&gtest_ar,0x113a,
                            test_data_callback,test_state_callback,&dummy);
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((ulong)local_68.ptr_._4_4_ << 0x20);
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_2.success_,(char *)&r,(int *)&local_68,actual);
      if (gtest_ar_2.success_ == false) {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0xa6;
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_2.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((internal *)&gtest_ar_2,"stream","nullptr",&stream,&local_68.ptr_);
        if (gtest_ar_2.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          cubeb_stream_destroy(stream);
          cubeb_destroy(ctx);
          return;
        }
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar3 = 0xa7;
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
      }
      this_00 = &gtest_ar_2.message_;
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,iVar3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      goto LAB_001085a2;
    }
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x9c;
    gtest_ar_2._0_8_ = psVar2;
  }
  this_00 = &gtest_ar.message_;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stream,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar3,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&stream,(Message *)&gtest_ar_2);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stream);
  if (gtest_ar_2._0_8_ != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (gtest_ar_2._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
  }
LAB_001085a2:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, init_destroy_stream)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_data_callback, test_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);
}